

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

UChar * CReg::get(char *id)

{
  int iVar1;
  UChar *pUVar2;
  CReg *pCVar3;
  
  umtx_lock_63(&gCRegLock);
  pCVar3 = gCRegHead;
  ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
  pUVar2 = (UChar *)0x0;
  do {
    if (pCVar3 == (CReg *)0x0) {
LAB_002b87ba:
      umtx_unlock_63(&gCRegLock);
      return pUVar2;
    }
    iVar1 = strcmp(id,pCVar3->id);
    if (iVar1 == 0) {
      pUVar2 = pCVar3->iso;
      goto LAB_002b87ba;
    }
    pCVar3 = pCVar3->next;
  } while( true );
}

Assistant:

static const UChar* get(const char* id) {
        const UChar* result = NULL;
        umtx_lock(&gCRegLock);
        CReg* p = gCRegHead;

        /* register cleanup of the mutex */
        ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
        while (p) {
            if (uprv_strcmp(id, p->id) == 0) {
                result = p->iso;
                break;
            }
            p = p->next;
        }
        umtx_unlock(&gCRegLock);
        return result;
    }